

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode_ls.c
# Opt level: O0

int cvLsSolve(CVodeMem cv_mem,N_Vector b,N_Vector weight,N_Vector ynow,N_Vector fnow)

{
  int *piVar1;
  int iVar2;
  uint uVar3;
  undefined8 in_RCX;
  CVodeMem in_RDI;
  undefined8 in_R8;
  N_Vector x;
  int retval;
  int nli_inc;
  int curiter;
  realtype w_mean;
  realtype delta;
  realtype deltar;
  realtype bnorm;
  CVLsMem cvls_mem;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  undefined4 in_stack_ffffffffffffffa0;
  int iVar4;
  uint in_stack_ffffffffffffffa4;
  N_Vector in_stack_ffffffffffffffa8;
  SUNMatrix in_stack_ffffffffffffffb8;
  SUNLinearSolver in_stack_ffffffffffffffc0;
  int local_4;
  
  if (in_RDI->cv_lmem == (void *)0x0) {
    cvProcessError(in_RDI,-2,"CVLS","cvLsSolve","Linear solver memory is NULL.");
    local_4 = -2;
  }
  else {
    piVar1 = (int *)in_RDI->cv_lmem;
    iVar2 = SUNNonlinSolGetCurIter
                      ((SUNNonlinearSolver)
                       CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),(int *)0xefb5a6
                      );
    if (*piVar1 == 0) {
      x = (N_Vector)0x0;
    }
    else {
      in_stack_ffffffffffffffb8 = (SUNMatrix)(*(double *)(piVar1 + 0xe) * in_RDI->cv_tq[4]);
      in_stack_ffffffffffffffc0 =
           (SUNLinearSolver)
           N_VWrmsNorm((N_Vector)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                       (N_Vector)CONCAT44(iVar2,in_stack_ffffffffffffff98));
      if ((double)in_stack_ffffffffffffffc0 <= (double)in_stack_ffffffffffffffb8) {
        if (0 < (int)in_stack_ffffffffffffffa4) {
          N_VConst((realtype)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                   (N_Vector)CONCAT44(iVar2,in_stack_ffffffffffffff98));
        }
        piVar1[0x4c] = 0;
        return piVar1[0x4c];
      }
      x = (N_Vector)((double)in_stack_ffffffffffffffb8 * *(double *)(piVar1 + 0x10));
    }
    *(undefined8 *)(piVar1 + 0x1c) = in_RCX;
    *(undefined8 *)(piVar1 + 0x1e) = in_R8;
    if (*(long *)(*(long *)(*(long *)(piVar1 + 0x12) + 8) + 0x20) == 0) {
      if (*piVar1 != 0) {
        N_VConst((realtype)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                 (N_Vector)CONCAT44(iVar2,in_stack_ffffffffffffff98));
        in_stack_ffffffffffffffa8 =
             (N_Vector)
             N_VWrmsNorm((N_Vector)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                         (N_Vector)CONCAT44(iVar2,in_stack_ffffffffffffff98));
        x = (N_Vector)((double)x / (double)in_stack_ffffffffffffffa8);
      }
    }
    else {
      iVar2 = SUNLinSolSetScalingVectors
                        ((SUNLinearSolver)x,in_stack_ffffffffffffffa8,
                         (N_Vector)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
      if (iVar2 != 0) {
        cvProcessError(in_RDI,-9,"CVLS","cvLsSolve","Error in calling SUNLinSolSetScalingVectors");
        piVar1[0x4c] = -9;
        return piVar1[0x4c];
      }
      iVar2 = 0;
    }
    N_VConst((realtype)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
             (N_Vector)CONCAT44(iVar2,in_stack_ffffffffffffff98));
    uVar3 = SUNLinSolSetZeroGuess((SUNLinearSolver)CONCAT44(iVar2,in_stack_ffffffffffffff98),0);
    if (uVar3 == 0) {
      if (*(long *)(piVar1 + 0x3e) != 0) {
        iVar2 = (**(code **)(piVar1 + 0x3e))
                          (in_RDI->cv_tn,in_RCX,in_R8,*(undefined8 *)(piVar1 + 0x44));
        piVar1[0x4c] = iVar2;
        *(long *)(piVar1 + 0x30) = *(long *)(piVar1 + 0x30) + 1;
        if (piVar1[0x4c] != 0) {
          cvProcessError(in_RDI,(int)(ulong)uVar3,"CVLS","cvLsSolve",
                         "The Jacobian x vector setup routine failed in an unrecoverable manner.");
          return piVar1[0x4c];
        }
      }
      iVar2 = SUNLinSolSolve(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,x,
                             in_stack_ffffffffffffffa8,
                             (realtype)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0)
                            );
      N_VScale((realtype)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
               (N_Vector)CONCAT44(iVar2,in_stack_ffffffffffffff98),(N_Vector)0xefb87a);
      if ((piVar1[0xc] != 0) && ((in_RDI->cv_gamrat != 1.0 || (NAN(in_RDI->cv_gamrat))))) {
        N_VScale((realtype)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                 (N_Vector)CONCAT44(iVar2,in_stack_ffffffffffffff98),(N_Vector)0xefb8d4);
      }
      iVar4 = 0;
      if ((*piVar1 != 0) && (*(long *)(*(long *)(*(long *)(piVar1 + 0x12) + 8) + 0x48) != 0)) {
        iVar4 = SUNLinSolNumIters((SUNLinearSolver)((ulong)in_stack_ffffffffffffffa4 << 0x20));
      }
      *(long *)(piVar1 + 0x2a) = (long)iVar4 + *(long *)(piVar1 + 0x2a);
      if (iVar2 != 0) {
        *(long *)(piVar1 + 0x2e) = *(long *)(piVar1 + 0x2e) + 1;
      }
      piVar1[0x4c] = iVar2;
      if (1 < iVar2 + 0x32bU) {
        if (iVar2 == -0x329) {
          cvProcessError(in_RDI,-0x329,"CVLS","cvLsSolve","Failure in SUNLinSol external package");
          return -1;
        }
        if (iVar2 == -0x328) {
          cvProcessError(in_RDI,-0x328,"CVLS","cvLsSolve",
                         "The preconditioner solve routine failed in an unrecoverable manner.");
          return -1;
        }
        if (iVar2 == -0x325) {
          cvProcessError(in_RDI,-0x325,"CVLS","cvLsSolve",
                         "The Jacobian x vector routine failed in an unrecoverable manner.");
          return -1;
        }
        if (2 < iVar2 + 0x323U) {
          if (iVar2 == 0) {
            return 0;
          }
          if (iVar2 != 0x321) {
            if ((1 < iVar2 - 0x322U) && (3 < iVar2 - 0x325U)) {
              return 0;
            }
            return 1;
          }
          if (in_stack_ffffffffffffffa4 == 0) {
            return 0;
          }
          return 1;
        }
      }
      local_4 = -1;
    }
    else {
      local_4 = -1;
    }
  }
  return local_4;
}

Assistant:

int cvLsSolve(CVodeMem cv_mem, N_Vector b, N_Vector weight,
              N_Vector ynow, N_Vector fnow)
{
  CVLsMem  cvls_mem;
  realtype bnorm, deltar, delta, w_mean;
  int      curiter, nli_inc, retval;
#if SUNDIALS_LOGGING_LEVEL >= SUNDIALS_LOGGING_INFO
  realtype resnorm;
  long int nps_inc;
#endif


  /* access CVLsMem structure */
  if (cv_mem->cv_lmem==NULL) {
    cvProcessError(cv_mem, CVLS_LMEM_NULL, "CVLS",
                   "cvLsSolve", MSG_LS_LMEM_NULL);
    return(CVLS_LMEM_NULL);
  }
  cvls_mem = (CVLsMem) cv_mem->cv_lmem;

  /* get current nonlinear solver iteration */
  retval = SUNNonlinSolGetCurIter(cv_mem->NLS, &curiter);

  /* If the linear solver is iterative:
     test norm(b), if small, return x = 0 or x = b;
     set linear solver tolerance (in left/right scaled 2-norm) */
  if (cvls_mem->iterative) {
    deltar = cvls_mem->eplifac * cv_mem->cv_tq[4];
    bnorm = N_VWrmsNorm(b, weight);
    if (bnorm <= deltar) {
      if (curiter > 0) N_VConst(ZERO, b);
      cvls_mem->last_flag = CVLS_SUCCESS;
      return(cvls_mem->last_flag);
    }
    /* Adjust tolerance for 2-norm */
    delta = deltar * cvls_mem->nrmfac;
  } else {
    delta = ZERO;
  }

  /* Set vectors ycur and fcur for use by the Atimes and Psolve
     interface routines */
  cvls_mem->ycur = ynow;
  cvls_mem->fcur = fnow;

  /* Set scaling vectors for LS to use (if applicable) */
  if (cvls_mem->LS->ops->setscalingvectors) {
    retval = SUNLinSolSetScalingVectors(cvls_mem->LS,
                                        weight,
                                        weight);
    if (retval != SUNLS_SUCCESS) {
      cvProcessError(cv_mem, CVLS_SUNLS_FAIL, "CVLS", "cvLsSolve",
                     "Error in calling SUNLinSolSetScalingVectors");
      cvls_mem->last_flag = CVLS_SUNLS_FAIL;
      return(cvls_mem->last_flag);
    }

  /* If solver is iterative and does not support scaling vectors, update the
     tolerance in an attempt to account for weight vector.  We make the
     following assumptions:
       1. w_i = w_mean, for i=0,...,n-1 (i.e. the weights are homogeneous)
       2. the linear solver uses a basic 2-norm to measure convergence
     Hence (using the notation from sunlinsol_spgmr.h, with S = diag(w)),
           || bbar - Abar xbar ||_2 < tol
       <=> || S b - S A x ||_2 < tol
       <=> || S (b - A x) ||_2 < tol
       <=> \sum_{i=0}^{n-1} (w_i (b - A x)_i)^2 < tol^2
       <=> w_mean^2 \sum_{i=0}^{n-1} (b - A x_i)^2 < tol^2
       <=> \sum_{i=0}^{n-1} (b - A x_i)^2 < tol^2 / w_mean^2
       <=> || b - A x ||_2 < tol / w_mean
     So we compute w_mean = ||w||_RMS = ||w||_2 and scale the desired tolerance accordingly. */
  } else if (cvls_mem->iterative) {

    N_VConst(ONE, cvls_mem->x);
    w_mean = N_VWrmsNorm(weight, cvls_mem->x);
    delta /= w_mean;

  }

  /* Set initial guess x = 0 to LS */
  N_VConst(ZERO, cvls_mem->x);

  /* Set zero initial guess flag */
  retval = SUNLinSolSetZeroGuess(cvls_mem->LS, SUNTRUE);
  if (retval != SUNLS_SUCCESS) return(-1);

#if SUNDIALS_LOGGING_LEVEL >= SUNDIALS_LOGGING_INFO
  /* Store previous nps value in nps_inc */
  nps_inc = cvls_mem->nps;
#endif
  /* If a user-provided jtsetup routine is supplied, call that here */
  if (cvls_mem->jtsetup) {
    cvls_mem->last_flag = cvls_mem->jtsetup(cv_mem->cv_tn, ynow, fnow,
                                            cvls_mem->jt_data);
    cvls_mem->njtsetup++;
    if (cvls_mem->last_flag != 0) {
      cvProcessError(cv_mem, retval, "CVLS",
                     "cvLsSolve", MSG_LS_JTSETUP_FAILED);
      return(cvls_mem->last_flag);
    }
  }

  /* Call solver, and copy x to b */
  retval = SUNLinSolSolve(cvls_mem->LS, cvls_mem->A, cvls_mem->x, b, delta);
  N_VScale(ONE, cvls_mem->x, b);

  /* If using a direct or matrix-iterative solver, BDF method, and gamma has changed,
     scale the correction to account for change in gamma */
  if (cvls_mem->scalesol && cv_mem->cv_gamrat != ONE)
    N_VScale(TWO/(ONE + cv_mem->cv_gamrat), b, b);

  /* Retrieve statistics from iterative linear solvers */
#if SUNDIALS_LOGGING_LEVEL >= SUNDIALS_LOGGING_INFO
  resnorm = ZERO;
#endif
  nli_inc = 0;
  if (cvls_mem->iterative) {
#if SUNDIALS_LOGGING_LEVEL >= SUNDIALS_LOGGING_INFO
    if (cvls_mem->LS->ops->resnorm)
      resnorm = SUNLinSolResNorm(cvls_mem->LS);
#endif
    if (cvls_mem->LS->ops->numiters)
      nli_inc = SUNLinSolNumIters(cvls_mem->LS);
  }


  /* Increment counters nli and ncfl */
  cvls_mem->nli += nli_inc;
  if (retval != SUNLS_SUCCESS) cvls_mem->ncfl++;

  /* Interpret solver return value  */
  cvls_mem->last_flag = retval;

#if SUNDIALS_LOGGING_LEVEL >= SUNDIALS_LOGGING_INFO
  SUNLogger_QueueMsg(CV_LOGGER, SUN_LOGLEVEL_INFO,
    "CVODE::cvLsSolve", "ls-stats",
    "bnorm = %.16g, resnorm = %.16g, ls_iters = %i, prec_solves = %i",
    bnorm, resnorm, nli_inc, (int)(cvls_mem->nps - nps_inc));
#endif

  switch(retval) {

  case SUNLS_SUCCESS:
    return(0);
    break;
  case SUNLS_RES_REDUCED:
    /* allow reduction but not solution on first Newton iteration,
       otherwise return with a recoverable failure */
    if (curiter == 0) return(0);
    else              return(1);
    break;
  case SUNLS_CONV_FAIL:
  case SUNLS_ATIMES_FAIL_REC:
  case SUNLS_PSOLVE_FAIL_REC:
  case SUNLS_PACKAGE_FAIL_REC:
  case SUNLS_QRFACT_FAIL:
  case SUNLS_LUFACT_FAIL:
    return(1);
    break;
  case SUNLS_MEM_NULL:
  case SUNLS_ILL_INPUT:
  case SUNLS_MEM_FAIL:
  case SUNLS_GS_FAIL:
  case SUNLS_QRSOL_FAIL:
    return(-1);
    break;
  case SUNLS_PACKAGE_FAIL_UNREC:
    cvProcessError(cv_mem, SUNLS_PACKAGE_FAIL_UNREC, "CVLS",
                   "cvLsSolve",
                    "Failure in SUNLinSol external package");
    return(-1);
    break;
  case SUNLS_ATIMES_FAIL_UNREC:
    cvProcessError(cv_mem, SUNLS_ATIMES_FAIL_UNREC, "CVLS",
                   "cvLsSolve", MSG_LS_JTIMES_FAILED);
    return(-1);
    break;
  case SUNLS_PSOLVE_FAIL_UNREC:
    cvProcessError(cv_mem, SUNLS_PSOLVE_FAIL_UNREC, "CVLS",
                   "cvLsSolve", MSG_LS_PSOLVE_FAILED);
    return(-1);
    break;
  }

  return(0);
}